

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reporter.cc
# Opt level: O0

void __thiscall
benchmark::CSVReporter::ReportRuns
          (CSVReporter *this,
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          *reports)

{
  bool bVar1;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *in_RDI;
  Run *run;
  const_iterator __end1;
  const_iterator __begin1;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  *__range1;
  Run *in_stack_00000238;
  CSVReporter *in_stack_00000240;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (Run *)std::
              vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
              ::begin(in_RDI);
  std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  ::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
         ::operator*(local_20);
    PrintRunData(in_stack_00000240,in_stack_00000238);
    __gnu_cxx::
    __normal_iterator<const_benchmark::BenchmarkReporter::Run_*,_std::vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void CSVReporter::ReportRuns(const std::vector<Run> & reports) {
  for (const auto& run : reports)
    PrintRunData(run);
}